

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

int32_t zng_deflatePrime(zng_stream *strm,int32_t bits,int32_t value)

{
  deflate_state *s;
  int iVar1;
  int32_t iVar2;
  int iVar3;
  ulong uVar4;
  
  iVar1 = deflateStateCheck(strm);
  iVar2 = -2;
  if (((iVar1 == 0) && (iVar2 = -5, (uint)bits < 0x41)) &&
     (s = strm->state, s->pending_out + 8 <= s->d_buf)) {
    uVar4 = (ulong)value;
    do {
      iVar1 = s->bi_valid;
      iVar3 = 0x40 - iVar1;
      if (bits <= 0x40 - iVar1) {
        iVar3 = bits;
      }
      if (iVar1 == 0) {
        s->bi_buf = uVar4;
      }
      else {
        s->bi_buf = s->bi_buf | (~(-1L << ((byte)iVar3 & 0x3f)) & uVar4) << ((byte)iVar1 & 0x3f);
      }
      s->bi_valid = iVar1 + iVar3;
      zng_tr_flush_bits(s);
      uVar4 = uVar4 >> ((byte)iVar3 & 0x3f);
      bits = bits - iVar3;
    } while (bits != 0);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflatePrime)(PREFIX3(stream) *strm, int32_t bits, int32_t value) {
    deflate_state *s;
    uint64_t value64 = (uint64_t)value;
    int32_t put;

    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    s = strm->state;

#ifdef LIT_MEM
    if (bits < 0 || bits > BIT_BUF_SIZE ||
        (unsigned char *)s->d_buf < s->pending_out + ((BIT_BUF_SIZE + 7) >> 3))
        return Z_BUF_ERROR;
#else
    if (bits < 0 || bits > BIT_BUF_SIZE || bits > (int32_t)(sizeof(value) << 3) ||
        s->sym_buf < s->pending_out + ((BIT_BUF_SIZE + 7) >> 3))
        return Z_BUF_ERROR;
#endif

    do {
        put = BIT_BUF_SIZE - s->bi_valid;
        put = MIN(put, bits);

        if (s->bi_valid == 0)
            s->bi_buf = value64;
        else
            s->bi_buf |= (value64 & ((UINT64_C(1) << put) - 1)) << s->bi_valid;
        s->bi_valid += put;
        zng_tr_flush_bits(s);
        value64 >>= put;
        bits -= put;
    } while (bits);
    return Z_OK;
}